

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotionImposed.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotionImposed::ArchiveOUT(ChLinkMotionImposed *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunctionRotation>_> local_48;
  ChNameValue<std::shared_ptr<chrono::ChFunctionPosition>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMotionImposed>(marchive);
  ChLinkMateGeneric::ArchiveOUT(&this->super_ChLinkMateGeneric,marchive);
  local_30._value = &this->position_function;
  local_30._name = "position_function";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->rotation_function;
  local_48._name = "rotation_function";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChLinkMotionImposed::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotionImposed>();

    // serialize parent class
    ChLinkMateGeneric::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(position_function);
	marchive << CHNVP(rotation_function);
}